

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall ktx::CommandCompare::executeCompare(CommandCompare *this)

{
  int iVar1;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view filepath;
  string_view filepath_00;
  ulong uVar2;
  bool bVar3;
  undefined1 uVar4;
  underlying_type_t<ktx::ReturnCode> uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  ulong uVar10;
  size_t sVar11;
  undefined8 uVar12;
  PrintIndent *pPVar13;
  int extraout_var;
  long in_RDI;
  undefined1 auVar14 [16];
  PrintDiff diff_1;
  size_t i_6;
  bool last_1;
  size_t i_5;
  bool last;
  size_t i_4;
  bool first;
  PrintIndent pi;
  ostringstream messagesOS_1;
  size_t i_3;
  PrintIndent out_1;
  char *nl;
  char *space;
  int indentWidth;
  int baseIndent;
  int fatalValidationError;
  PrintDiff diff;
  PrintIndent out;
  size_t i_2;
  size_t i_1;
  bool hasValidationMessages;
  ostringstream messagesOS;
  size_t i;
  vector<int,_std::allocator<int>_> validationResults;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  validationMessages;
  InputStreams inputStreams;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs_4;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs_2;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_5;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_3;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_const_char_*>
  *vargs_7;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_const_char_*>
  *vargs_6;
  undefined4 in_stack_ffffffffffffe978;
  ReturnCode in_stack_ffffffffffffe97c;
  InputStreams *in_stack_ffffffffffffe980;
  PrintDiff *this_00;
  PrintDiff *in_stack_ffffffffffffe988;
  array<ktx::InputStream,_2UL> *in_stack_ffffffffffffe990;
  char **in_stack_ffffffffffffe998;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_stack_ffffffffffffe9a0;
  undefined7 in_stack_ffffffffffffe9a8;
  undefined1 in_stack_ffffffffffffe9af;
  allocator<char> *in_stack_ffffffffffffe9b0;
  allocator<char> *__a;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe9c0;
  undefined4 in_stack_ffffffffffffe9c8;
  int in_stack_ffffffffffffe9cc;
  value_type vVar15;
  PrintIndent *in_stack_ffffffffffffe9d0;
  undefined4 in_stack_ffffffffffffe9d8;
  int in_stack_ffffffffffffe9dc;
  PrintIndent *in_stack_ffffffffffffe9e0;
  undefined8 in_stack_ffffffffffffe9e8;
  size_t *psVar16;
  PrintIndent *in_stack_ffffffffffffe9f0;
  Reporter *in_stack_ffffffffffffea50;
  string *in_stack_ffffffffffffea58;
  InputStream *in_stack_ffffffffffffea60;
  char **local_14a8;
  undefined1 local_14a0 [32];
  string local_1480 [39];
  allocator<char> local_1459;
  string local_1458 [32];
  PrintDiff local_1438;
  ulong local_13d8;
  char *local_13d0;
  char *local_13c8;
  char *local_13c0;
  size_t local_13b8;
  byte local_13a9;
  ulong local_13a8;
  char *local_13a0;
  undefined1 local_1392;
  byte local_1391;
  ulong local_1390;
  string local_1388 [32];
  undefined1 *local_1368;
  ostringstream **local_1360;
  char **local_1358;
  char **local_1350;
  undefined1 local_1328 [16];
  string local_1318 [32];
  int local_12f8;
  undefined1 local_12f1;
  ostringstream *local_12f0;
  undefined4 local_12e8;
  int local_12e4;
  ostringstream local_12e0 [16];
  function<void_(const_ktx::ValidationReport_&)> *in_stack_ffffffffffffed30;
  undefined1 in_stack_ffffffffffffed3e;
  undefined1 in_stack_ffffffffffffed3f;
  string *in_stack_ffffffffffffed40;
  istream *in_stack_ffffffffffffed48;
  InputStreams *in_stack_ffffffffffffed90;
  PrintDiff *in_stack_ffffffffffffed98;
  CommandCompare *in_stack_ffffffffffffeda0;
  InputStreams *in_stack_ffffffffffffee08;
  PrintDiff *in_stack_ffffffffffffee10;
  CommandCompare *in_stack_ffffffffffffee18;
  ulong local_1168;
  char *local_1150;
  char *local_1148;
  int local_113c;
  undefined4 local_1138;
  value_type local_1134;
  PrintDiff local_1130;
  undefined8 *local_10d0;
  undefined4 local_10c8;
  undefined4 local_10c4;
  char *local_10c0;
  size_t local_10b8;
  ulong local_10b0;
  char *local_10a8;
  size_t local_10a0;
  char *local_1098 [2];
  char *local_1088;
  char *local_1080;
  size_t local_1078;
  char *local_1070 [2];
  undefined1 local_1059;
  ulong local_1058;
  byte local_1049;
  string local_1048 [32];
  ostringstream *local_1028;
  undefined1 local_1000 [16];
  string local_ff0 [36];
  int local_fcc;
  ostringstream local_fc8 [328];
  InputStreams *in_stack_fffffffffffff180;
  PrintDiff *in_stack_fffffffffffff188;
  CommandCompare *in_stack_fffffffffffff190;
  ulong local_e50;
  vector<int,_std::allocator<int>_> local_e48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e30;
  undefined1 *local_e08;
  undefined1 local_e00 [296];
  InputStreams *in_stack_fffffffffffff328;
  PrintDiff *in_stack_fffffffffffff330;
  CommandCompare *in_stack_fffffffffffff338;
  undefined1 auStack_a48 [928];
  InputStreams *in_stack_fffffffffffff958;
  PrintDiff *in_stack_fffffffffffff960;
  CommandCompare *in_stack_fffffffffffff968;
  undefined8 local_688;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_680;
  char *local_678;
  size_t local_670;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_668 [3];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_650;
  char *local_648;
  size_t sStack_640;
  undefined8 local_638;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_630;
  char *local_628;
  size_t local_620;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_618 [3];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_600;
  char *local_5f8;
  size_t sStack_5f0;
  undefined8 local_5e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_5e0;
  char *local_5d8;
  size_t local_5d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_5c8 [3];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_5b0;
  char *local_5a8;
  size_t sStack_5a0;
  char *local_598;
  char **local_590;
  char *local_588;
  char **local_580;
  char *local_578;
  char **local_570;
  undefined8 local_568;
  undefined1 *local_560;
  char *local_558;
  size_t local_550;
  undefined1 local_548 [40];
  undefined1 *local_520;
  reference local_518;
  char **local_510;
  char *local_508;
  size_t sStack_500;
  char *local_4f8;
  char **local_4f0;
  undefined8 local_4e8;
  PrintIndent **local_4e0;
  char *local_4d8;
  size_t local_4d0;
  PrintIndent *local_4c8 [2];
  PrintIndent **local_4b8;
  reference local_4b0;
  char *local_4a8;
  size_t sStack_4a0;
  undefined8 local_498;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_490;
  char *local_488;
  size_t local_480;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_478 [2];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_468;
  reference local_460;
  char *local_458;
  size_t sStack_450;
  char *local_448;
  char **local_440;
  char *local_438;
  char **local_430;
  undefined8 local_428;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_const_char_*>
  *local_420;
  char **local_418;
  PrintIndent *local_410;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_const_char_*>
  local_408;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_const_char_*>
  *local_3e0;
  v10 *local_3d8;
  v10 *local_3d0;
  char **local_3c8;
  PrintIndent *pPStack_3c0;
  char *local_340;
  char ***local_338;
  char *local_330;
  char ***local_328;
  char *local_310;
  char **local_308;
  char *local_300;
  char **local_2f8;
  char *local_2f0;
  char **local_2e8;
  char *local_2e0;
  char **local_2d8;
  char *local_2d0;
  char **local_2c8;
  char *local_2c0;
  char **local_2b8;
  char **local_2b0;
  char *local_2a8;
  size_t sStack_2a0;
  char **local_290;
  char *local_288;
  size_t sStack_280;
  char **local_270;
  char *local_268;
  size_t sStack_260;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_250;
  undefined8 *local_248;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_240;
  undefined8 local_238;
  undefined8 *local_230;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_228;
  undefined8 *local_220;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_218;
  undefined8 local_210;
  undefined8 *local_208;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_200;
  undefined8 *local_1f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1f0;
  undefined8 local_1e8;
  undefined8 *local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1c0;
  undefined8 *local_1b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1b0;
  undefined8 local_1a8;
  undefined8 *local_1a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_198;
  PrintIndent **local_190;
  undefined8 *local_188;
  PrintIndent **local_180;
  undefined8 local_178;
  undefined8 *local_170;
  PrintIndent **local_168;
  char **local_160;
  char *local_158;
  size_t sStack_150;
  char **local_140;
  char *local_138;
  size_t sStack_130;
  undefined1 *local_120;
  undefined8 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined8 local_100;
  undefined8 *local_f8;
  char ***local_d0;
  char **local_c8;
  PrintIndent *pPStack_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_const_char_*>
  *local_88;
  undefined8 *local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_const_char_*>
  *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_const_char_*>
  *local_70;
  undefined8 local_68;
  undefined8 *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char **local_40;
  char *local_38;
  size_t sStack_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  
  local_e08 = local_e00;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)in_stack_ffffffffffffe980,
             CONCAT44(in_stack_ffffffffffffe97c,in_stack_ffffffffffffe978));
  InputStream::InputStream
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  local_e08 = auStack_a48;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)in_stack_ffffffffffffe980,
             CONCAT44(in_stack_ffffffffffffe97c,in_stack_ffffffffffffe978));
  InputStream::InputStream
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x155de1);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x155dee);
  iVar1 = *(int *)(in_RDI + 0x48);
  if (iVar1 == 0) {
    local_e50 = 0;
    while( true ) {
      sVar6 = std::array<ktx::InputStream,_2UL>::size((array<ktx::InputStream,_2UL> *)local_e00);
      if (sVar6 <= local_e50) break;
      std::__cxx11::ostringstream::ostringstream(local_fc8);
      pvVar7 = std::array<ktx::InputStream,_2UL>::operator[]
                         (in_stack_ffffffffffffe980,
                          CONCAT44(in_stack_ffffffffffffe97c,in_stack_ffffffffffffe978));
      InputStream::operator_cast_to_istream_(pvVar7);
      pvVar8 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
               ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                             *)in_stack_ffffffffffffe980,
                            CONCAT44(in_stack_ffffffffffffe97c,in_stack_ffffffffffffe978));
      auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar8);
      filepath._M_str._0_4_ = in_stack_ffffffffffffe9d8;
      filepath._M_len = (size_t)in_stack_ffffffffffffe9d0;
      filepath._M_str._4_4_ = in_stack_ffffffffffffe9dc;
      local_1000 = auVar14;
      fmtInFile_abi_cxx11_(filepath);
      local_1028 = local_fc8;
      std::function<void(ktx::ValidationReport_const&)>::
      function<ktx::CommandCompare::executeCompare()::__0,void>
                ((function<void_(const_ktx::ValidationReport_&)> *)in_stack_ffffffffffffe990,
                 (anon_class_8_1_38b231ee *)in_stack_ffffffffffffe988);
      local_fcc = validateIOStream(in_stack_ffffffffffffed48,in_stack_ffffffffffffed40,
                                   (bool)in_stack_ffffffffffffed3f,(bool)in_stack_ffffffffffffed3e,
                                   in_stack_ffffffffffffed30);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe990,
                 (int *)in_stack_ffffffffffffe988);
      std::function<void_(const_ktx::ValidationReport_&)>::~function
                ((function<void_(const_ktx::ValidationReport_&)> *)0x155ffa);
      std::__cxx11::string::~string(local_ff0);
      std::__cxx11::ostringstream::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffe990,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe988);
      std::__cxx11::string::~string(local_1048);
      std::__cxx11::ostringstream::~ostringstream(local_fc8);
      local_e50 = local_e50 + 1;
    }
    local_1049 = 0;
    local_1058 = 0;
    while( true ) {
      uVar10 = local_1058;
      sVar6 = std::array<ktx::InputStream,_2UL>::size((array<ktx::InputStream,_2UL> *)local_e00);
      if (sVar6 <= uVar10) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_e30,local_1058);
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        local_1059 = 1;
        bVar3 = std::exchange<bool,bool>
                          ((bool *)in_stack_ffffffffffffe980,
                           (bool *)CONCAT44(in_stack_ffffffffffffe97c,in_stack_ffffffffffffe978));
        if (bVar3) {
          local_590 = local_1070;
          local_598 = "\n";
          local_2c0 = "\n";
          local_1070[0] = "\n";
          local_2b8 = local_590;
          sStack_5a0 = std::char_traits<char>::length((char_type *)0x156205);
          local_48 = local_598;
          local_5a8 = local_1070[0];
          local_5c8[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
          ;
          local_5b0 = local_5c8;
          local_2b0 = &local_5a8;
          local_5d8 = local_5a8;
          local_5d0 = sStack_5a0;
          local_248 = &local_5e8;
          local_238 = 0;
          local_5e8 = 0;
          fmt.data_._7_1_ = in_stack_ffffffffffffe9af;
          fmt.data_._0_7_ = in_stack_ffffffffffffe9a8;
          fmt.size_ = (size_t)in_stack_ffffffffffffe9b0;
          args.field_1.values_ = in_stack_ffffffffffffe9a0.values_;
          args.desc_ = (unsigned_long_long)in_stack_ffffffffffffe998;
          local_2a8 = local_5d8;
          sStack_2a0 = local_5d0;
          local_250 = local_5b0;
          local_240 = local_5b0;
          local_230 = local_248;
          local_1c8 = local_5b0;
          local_5e0 = local_5b0;
          ::fmt::v10::vprint(fmt,args);
        }
        local_4f0 = &local_1080;
        local_4f8 = "Validation {} for \'{}\'\n";
        local_2f0 = "Validation {} for \'{}\'\n";
        local_1080 = "Validation {} for \'{}\'\n";
        local_2e8 = local_4f0;
        local_1078 = std::char_traits<char>::length((char_type *)0x1563ed);
        local_28 = local_4f8;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_e48,local_1058);
        local_1088 = "failed";
        if (*pvVar9 == 0) {
          local_1088 = "successful";
        }
        local_518 = std::
                    array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                    ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                                  *)in_stack_ffffffffffffe980,
                                 CONCAT44(in_stack_ffffffffffffe97c,in_stack_ffffffffffffe978));
        local_508 = local_1080;
        sStack_500 = local_1078;
        local_510 = &local_1088;
        ::fmt::v10::
        make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*,std::__cxx11::string>
                  (in_stack_ffffffffffffe998,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe990);
        local_520 = local_548;
        local_40 = &local_508;
        local_558 = local_508;
        local_550 = sStack_500;
        local_118 = &local_568;
        local_100 = 0xdc;
        local_568 = 0xdc;
        fmt_00.data_._7_1_ = in_stack_ffffffffffffe9af;
        fmt_00.data_._0_7_ = in_stack_ffffffffffffe9a8;
        fmt_00.size_ = (size_t)in_stack_ffffffffffffe9b0;
        args_00.field_1.values_ = in_stack_ffffffffffffe9a0.values_;
        args_00.desc_ = (unsigned_long_long)in_stack_ffffffffffffe998;
        local_120 = local_520;
        local_110 = local_520;
        local_108 = local_520;
        local_f8 = local_118;
        local_38 = local_558;
        sStack_30 = local_550;
        local_560 = local_520;
        ::fmt::v10::vprint(fmt_00,args_00);
        local_580 = local_1098;
        local_588 = "\n";
        local_2d0 = "\n";
        local_1098[0] = "\n";
        local_2c8 = local_580;
        sStack_5f0 = std::char_traits<char>::length((char_type *)0x15661f);
        local_50 = local_588;
        local_5f8 = local_1098[0];
        local_618[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_600 = local_618;
        local_290 = &local_5f8;
        local_628 = local_5f8;
        local_620 = sStack_5f0;
        local_220 = &local_638;
        local_210 = 0;
        local_638 = 0;
        fmt_01.data_._7_1_ = in_stack_ffffffffffffe9af;
        fmt_01.data_._0_7_ = in_stack_ffffffffffffe9a8;
        fmt_01.size_ = (size_t)in_stack_ffffffffffffe9b0;
        args_01.field_1.values_ = in_stack_ffffffffffffe9a0.values_;
        args_01.desc_ = (unsigned_long_long)in_stack_ffffffffffffe998;
        local_288 = local_628;
        sStack_280 = local_620;
        local_228 = local_600;
        local_218 = local_600;
        local_208 = local_220;
        local_1d0 = local_600;
        local_630 = local_600;
        ::fmt::v10::vprint(fmt_01,args_01);
        local_440 = &local_10a8;
        local_448 = "{}";
        local_300 = "{}";
        local_10a8 = "{}";
        local_2f8 = local_440;
        local_10a0 = std::char_traits<char>::length((char_type *)0x156805);
        local_18 = local_448;
        local_460 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&local_e30,local_1058);
        local_458 = local_10a8;
        sStack_450 = local_10a0;
        local_478[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffe988);
        local_468 = local_478;
        local_160 = &local_458;
        local_488 = local_458;
        local_480 = sStack_450;
        local_1b8 = &local_498;
        local_1a8 = 0xd;
        local_498 = 0xd;
        fmt_02.data_._7_1_ = in_stack_ffffffffffffe9af;
        fmt_02.data_._0_7_ = in_stack_ffffffffffffe9a8;
        fmt_02.size_ = (size_t)in_stack_ffffffffffffe9b0;
        args_02.field_1.values_ = in_stack_ffffffffffffe9a0.values_;
        args_02.desc_ = (unsigned_long_long)in_stack_ffffffffffffe998;
        local_1c0 = local_468;
        local_1b0 = local_468;
        local_1a0 = local_1b8;
        local_198 = local_468;
        local_158 = local_488;
        sStack_150 = local_480;
        local_490 = local_468;
        ::fmt::v10::vprint(fmt_02,args_02);
      }
      local_1058 = local_1058 + 1;
    }
    local_10b0 = 0;
    while( true ) {
      uVar10 = local_10b0;
      sVar6 = std::array<ktx::InputStream,_2UL>::size((array<ktx::InputStream,_2UL> *)local_e00);
      if (sVar6 <= uVar10) break;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_e48,local_10b0);
      if (*pvVar9 != 0) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_e48,local_10b0);
        iVar1 = *pvVar9;
        uVar5 = ktx::operator+(SUCCESS);
        if ((iVar1 != uVar5) || ((*(byte *)(in_RDI + 0xa0) & 1) == 0)) {
          uVar12 = __cxa_allocate_exception(0x10);
          std::vector<int,_std::allocator<int>_>::operator[](&local_e48,local_10b0);
          FatalError::FatalError((FatalError *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe97c);
          __cxa_throw(uVar12,&FatalError::typeinfo,FatalError::~FatalError);
        }
        *(undefined4 *)(in_RDI + 0x90) = 2;
      }
      local_10b0 = local_10b0 + 1;
    }
    if ((local_1049 & 1) != 0) {
      local_570 = &local_10c0;
      local_578 = "\n";
      local_2e0 = "\n";
      local_10c0 = "\n";
      psVar16 = &local_10b8;
      local_2d8 = local_570;
      sVar11 = std::char_traits<char>::length((char_type *)0x156b93);
      *psVar16 = sVar11;
      local_58 = local_578;
      local_648 = local_10c0;
      sStack_640 = local_10b8;
      local_668[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_650 = local_668;
      local_270 = &local_648;
      local_678 = local_648;
      local_670 = sStack_640;
      local_1f8 = &local_688;
      local_1e8 = 0;
      local_688 = 0;
      fmt_03.data_._7_1_ = in_stack_ffffffffffffe9af;
      fmt_03.data_._0_7_ = in_stack_ffffffffffffe9a8;
      fmt_03.size_ = (size_t)in_stack_ffffffffffffe9b0;
      args_03.field_1.values_ = in_stack_ffffffffffffe9a0.values_;
      args_03.desc_ = (unsigned_long_long)in_stack_ffffffffffffe998;
      local_268 = local_678;
      sStack_260 = local_670;
      local_200 = local_650;
      local_1f0 = local_650;
      local_1e0 = local_1f8;
      local_1d8 = local_650;
      local_680 = local_650;
      ::fmt::v10::vprint(fmt_03,args_03);
    }
    local_10d0 = &std::cout;
    local_10c8 = 0;
    local_10c4 = 4;
    PrintDiff::PrintDiff
              ((PrintDiff *)in_stack_ffffffffffffe990,(PrintIndent *)in_stack_ffffffffffffe988,
               (OutputFormat)((ulong)in_stack_ffffffffffffe980 >> 0x20));
    compareHeader(in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff180);
    compareLevelIndex(in_stack_ffffffffffffee18,in_stack_ffffffffffffee10,in_stack_ffffffffffffee08)
    ;
    compareDFD(in_stack_fffffffffffff338,in_stack_fffffffffffff330,in_stack_fffffffffffff328);
    compareKVD(in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98,in_stack_ffffffffffffed90);
    compareSGD(in_stack_fffffffffffff968,in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    compareImages((CommandCompare *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,
                  in_stack_ffffffffffffe980);
    bVar3 = PrintDiff::isDifferent(&local_1130);
    if (bVar3) {
      uVar12 = __cxa_allocate_exception(0x10);
      FatalError::FatalError((FatalError *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe97c);
      __cxa_throw(uVar12,&FatalError::typeinfo,FatalError::~FatalError);
    }
    PrintDiff::~PrintDiff((PrintDiff *)in_stack_ffffffffffffe980);
  }
  else if ((iVar1 == 1) || (iVar1 == 2)) {
    local_1134 = 0;
    local_1138 = 0;
    local_113c = (uint)(*(int *)(in_RDI + 0x48) == 1) << 2;
    local_1150 = "";
    local_1148 = "";
    if (*(int *)(in_RDI + 0x48) == 1) {
      local_1148 = " ";
    }
    if (*(int *)(in_RDI + 0x48) == 1) {
      local_1150 = "\n";
    }
    PrintIndent::operator()
              (in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9dc,
               (char (*) [5])in_stack_ffffffffffffe9d0,
               (char **)CONCAT44(in_stack_ffffffffffffe9cc,in_stack_ffffffffffffe9c8));
    PrintIndent::operator()
              (in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9dc,
               (char (*) [64])in_stack_ffffffffffffe9d0,
               (char **)CONCAT44(in_stack_ffffffffffffe9cc,in_stack_ffffffffffffe9c8),
               (char **)in_stack_ffffffffffffe9c0);
    local_1168 = 0;
    while( true ) {
      sVar6 = std::array<ktx::InputStream,_2UL>::size((array<ktx::InputStream,_2UL> *)local_e00);
      if (sVar6 <= local_1168) break;
      std::__cxx11::ostringstream::ostringstream(local_12e0);
      local_12f0 = local_12e0;
      local_12e8 = local_1138;
      local_12e4 = local_113c;
      local_12f1 = 1;
      pvVar7 = std::array<ktx::InputStream,_2UL>::operator[]
                         (in_stack_ffffffffffffe980,
                          CONCAT44(in_stack_ffffffffffffe97c,in_stack_ffffffffffffe978));
      InputStream::operator_cast_to_istream_(pvVar7);
      pvVar8 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
               ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                             *)in_stack_ffffffffffffe980,
                            CONCAT44(in_stack_ffffffffffffe97c,in_stack_ffffffffffffe978));
      auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar8);
      filepath_00._M_str._0_4_ = in_stack_ffffffffffffe9d8;
      filepath_00._M_len = (size_t)in_stack_ffffffffffffe9d0;
      filepath_00._M_str._4_4_ = in_stack_ffffffffffffe9dc;
      local_1328 = auVar14;
      fmtInFile_abi_cxx11_(filepath_00);
      local_1368 = &local_12f1;
      local_1360 = &local_12f0;
      local_1358 = &local_1150;
      local_1350 = &local_1148;
      std::function<void(ktx::ValidationReport_const&)>::
      function<ktx::CommandCompare::executeCompare()::__1,void>
                ((function<void_(const_ktx::ValidationReport_&)> *)in_stack_ffffffffffffe990,
                 (anon_class_32_4_d1f13690 *)in_stack_ffffffffffffe988);
      local_12f8 = validateIOStream(in_stack_ffffffffffffed48,in_stack_ffffffffffffed40,
                                    (bool)in_stack_ffffffffffffed3f,(bool)in_stack_ffffffffffffed3e,
                                    in_stack_ffffffffffffed30);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe990,
                 (int *)in_stack_ffffffffffffe988);
      std::function<void_(const_ktx::ValidationReport_&)>::~function
                ((function<void_(const_ktx::ValidationReport_&)> *)0x157167);
      std::__cxx11::string::~string(local_1318);
      std::__cxx11::ostringstream::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffe990,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe988);
      std::__cxx11::string::~string(local_1388);
      std::__cxx11::ostringstream::~ostringstream(local_12e0);
      local_1168 = local_1168 + 1;
    }
    PrintIndent::operator()
              (in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9dc,
               (char (*) [14])in_stack_ffffffffffffe9d0,
               (char **)CONCAT44(in_stack_ffffffffffffe9cc,in_stack_ffffffffffffe9c8),
               (char **)in_stack_ffffffffffffe9c0);
    local_1390 = 0;
    while( true ) {
      uVar10 = local_1390;
      sVar6 = std::array<ktx::InputStream,_2UL>::size((array<ktx::InputStream,_2UL> *)local_e00);
      uVar2 = local_1390;
      if (sVar6 <= uVar10) break;
      sVar6 = std::array<ktx::InputStream,_2UL>::size((array<ktx::InputStream,_2UL> *)local_e00);
      local_1391 = uVar2 == sVar6 - 1;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_e48,local_1390);
      local_1392 = *pvVar9 == 0;
      local_13a0 = ",";
      if ((local_1391 & 1) != 0) {
        local_13a0 = "";
      }
      PrintIndent::operator()
                (in_stack_ffffffffffffe9f0,(int)((ulong)in_stack_ffffffffffffe9e8 >> 0x20),
                 (char (*) [7])in_stack_ffffffffffffe9e0,
                 (bool *)CONCAT44(in_stack_ffffffffffffe9dc,in_stack_ffffffffffffe9d8),
                 (char **)in_stack_ffffffffffffe9d0,
                 (char **)CONCAT44(in_stack_ffffffffffffe9cc,in_stack_ffffffffffffe9c8));
      local_1390 = local_1390 + 1;
    }
    PrintIndent::operator()
              (in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9dc,
               (char (*) [5])in_stack_ffffffffffffe9d0,
               (char **)CONCAT44(in_stack_ffffffffffffe9cc,in_stack_ffffffffffffe9c8));
    PrintIndent::operator()
              (in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9dc,
               (char (*) [17])in_stack_ffffffffffffe9d0,
               (char **)CONCAT44(in_stack_ffffffffffffe9cc,in_stack_ffffffffffffe9c8),
               (char **)in_stack_ffffffffffffe9c0);
    local_13a8 = 0;
    while( true ) {
      uVar10 = local_13a8;
      sVar6 = std::array<ktx::InputStream,_2UL>::size((array<ktx::InputStream,_2UL> *)local_e00);
      uVar2 = local_13a8;
      if (sVar6 <= uVar10) break;
      sVar6 = std::array<ktx::InputStream,_2UL>::size((array<ktx::InputStream,_2UL> *)local_e00);
      local_13a9 = uVar2 == sVar6 - 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_e30,local_13a8);
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        PrintIndent::operator()
                  (in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9dc,
                   (char (*) [4])in_stack_ffffffffffffe9d0,
                   (char **)CONCAT44(in_stack_ffffffffffffe9cc,in_stack_ffffffffffffe9c8));
        local_430 = &local_13c0;
        local_438 = "{}";
        local_310 = "{}";
        local_13c0 = "{}";
        psVar16 = &local_13b8;
        local_308 = local_430;
        sVar11 = std::char_traits<char>::length((char_type *)0x15750b);
        *psVar16 = sVar11;
        local_20 = local_438;
        local_4b0 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&local_e30,local_13a8);
        local_4a8 = local_13c0;
        sStack_4a0 = local_13b8;
        in_stack_ffffffffffffe9e0 =
             (PrintIndent *)
             ::fmt::v10::
             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_ffffffffffffe988);
        local_4b8 = local_4c8;
        local_140 = &local_4a8;
        local_4d8 = local_4a8;
        local_4d0 = sStack_4a0;
        local_188 = &local_4e8;
        local_178 = 0xd;
        local_4e8 = 0xd;
        fmt_04.data_._7_1_ = in_stack_ffffffffffffe9af;
        fmt_04.data_._0_7_ = in_stack_ffffffffffffe9a8;
        fmt_04.size_ = (size_t)in_stack_ffffffffffffe9b0;
        args_04.field_1.values_ = in_stack_ffffffffffffe9a0.values_;
        args_04.desc_ = (unsigned_long_long)in_stack_ffffffffffffe998;
        in_stack_ffffffffffffe9dc = extraout_var;
        local_4c8[0] = in_stack_ffffffffffffe9e0;
        local_190 = local_4b8;
        local_180 = local_4b8;
        local_170 = local_188;
        local_168 = local_4b8;
        local_138 = local_4d8;
        sStack_130 = local_4d0;
        local_4e0 = local_4b8;
        ::fmt::v10::vprint(fmt_04,args_04);
        PrintIndent::operator()
                  (in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9dc,
                   (char (*) [5])in_stack_ffffffffffffe9d0,
                   (char **)CONCAT44(in_stack_ffffffffffffe9cc,in_stack_ffffffffffffe9c8));
        local_13c8 = ",";
        if ((local_13a9 & 1) != 0) {
          local_13c8 = "";
        }
        PrintIndent::operator()
                  (in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9dc,
                   (char (*) [6])in_stack_ffffffffffffe9d0,
                   (char **)CONCAT44(in_stack_ffffffffffffe9cc,in_stack_ffffffffffffe9c8),
                   (char **)in_stack_ffffffffffffe9c0);
      }
      else {
        local_13d0 = ",";
        if ((local_13a9 & 1) != 0) {
          local_13d0 = "";
        }
        PrintIndent::operator()
                  (in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9dc,
                   (char (*) [7])in_stack_ffffffffffffe9d0,
                   (char **)CONCAT44(in_stack_ffffffffffffe9cc,in_stack_ffffffffffffe9c8),
                   (char **)in_stack_ffffffffffffe9c0);
      }
      local_13a8 = local_13a8 + 1;
    }
    PrintIndent::operator()
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9cc,
               (char (*) [2])in_stack_ffffffffffffe9c0);
    local_13d8 = 0;
    while( true ) {
      uVar10 = local_13d8;
      sVar6 = std::array<ktx::InputStream,_2UL>::size((array<ktx::InputStream,_2UL> *)local_e00);
      if (sVar6 <= uVar10) break;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_e48,local_13d8);
      if (*pvVar9 != 0) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_e48,local_13d8);
        vVar15 = *pvVar9;
        uVar5 = ktx::operator+(SUCCESS);
        if ((vVar15 != uVar5) || ((*(byte *)(in_RDI + 0xa0) & 1) == 0)) {
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_e48,local_13d8);
          local_1134 = *pvVar9;
          break;
        }
        *(undefined4 *)(in_RDI + 0x90) = 2;
      }
      local_13d8 = local_13d8 + 1;
    }
    PrintDiff::PrintDiff
              ((PrintDiff *)in_stack_ffffffffffffe990,(PrintIndent *)in_stack_ffffffffffffe988,
               (OutputFormat)((ulong)in_stack_ffffffffffffe980 >> 0x20));
    if (local_1134 != 0) {
      uVar12 = __cxa_allocate_exception(0x10);
      FatalError::FatalError((FatalError *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe97c);
      __cxa_throw(uVar12,&FatalError::typeinfo,FatalError::~FatalError);
    }
    __s = &local_1459;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe9c0,(char *)__s,in_stack_ffffffffffffe9b0);
    PrintDiff::beginJsonSection
              ((PrintDiff *)in_stack_ffffffffffffe980,
               (string *)CONCAT44(in_stack_ffffffffffffe97c,in_stack_ffffffffffffe978));
    std::__cxx11::string::~string(local_1458);
    std::allocator<char>::~allocator(&local_1459);
    compareHeader(in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff180);
    compareLevelIndex(in_stack_ffffffffffffee18,in_stack_ffffffffffffee10,in_stack_ffffffffffffee08)
    ;
    compareDFD(in_stack_fffffffffffff338,in_stack_fffffffffffff330,in_stack_fffffffffffff328);
    compareKVD(in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98,in_stack_ffffffffffffed90);
    compareSGD(in_stack_fffffffffffff968,in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    PrintDiff::endJsonSection((PrintDiff *)in_stack_ffffffffffffe980);
    __a = (allocator<char> *)(local_14a0 + 0x1f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffe9c0,(char *)__s,__a);
    PrintDiff::beginJsonSection
              ((PrintDiff *)in_stack_ffffffffffffe980,
               (string *)CONCAT44(in_stack_ffffffffffffe97c,in_stack_ffffffffffffe978));
    std::__cxx11::string::~string(local_1480);
    std::allocator<char>::~allocator((allocator<char> *)(local_14a0 + 0x1f));
    compareImages((CommandCompare *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,
                  in_stack_ffffffffffffe980);
    PrintDiff::endJsonSection((PrintDiff *)in_stack_ffffffffffffe980);
    uVar4 = PrintDiff::isDifferent(&local_1438);
    if ((bool)uVar4) {
      uVar12 = __cxa_allocate_exception(0x10);
      FatalError::FatalError((FatalError *)in_stack_ffffffffffffe980,in_stack_ffffffffffffe97c);
      __cxa_throw(uVar12,&FatalError::typeinfo,FatalError::~FatalError);
    }
    local_338 = &local_14a8;
    local_340 = "{}}}{}";
    local_330 = "{}}}{}";
    local_14a8 = (char **)0x386184;
    this_00 = (PrintDiff *)local_14a0;
    local_328 = local_338;
    pPVar13 = (PrintIndent *)std::char_traits<char>::length((char_type *)0x157e3d);
    this_00->printIndent = pPVar13;
    local_10 = local_340;
    local_3c8 = local_14a8;
    pPStack_3c0 = (PrintIndent *)local_14a0._0_8_;
    local_3d8 = (v10 *)&local_1150;
    local_3d0 = local_3d8;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*const,char_const*const>
              (&local_408,local_3d8,(char **)local_3d8,local_14a8);
    local_3e0 = &local_408;
    local_d0 = &local_3c8;
    local_418 = local_3c8;
    local_410 = pPStack_3c0;
    local_80 = &local_428;
    local_68 = 0xcc;
    local_428 = 0xcc;
    fmt_05.data_._7_1_ = uVar4;
    fmt_05.data_._0_7_ = in_stack_ffffffffffffe9a8;
    fmt_05.size_ = (size_t)__a;
    args_05.field_1.values_ = in_stack_ffffffffffffe9a0.values_;
    args_05.desc_ = (unsigned_long_long)in_stack_ffffffffffffe998;
    local_c8 = local_418;
    pPStack_c0 = local_410;
    local_88 = local_3e0;
    local_78 = local_3e0;
    local_70 = local_3e0;
    local_60 = local_80;
    local_420 = local_3e0;
    ::fmt::v10::vprint(fmt_05,args_05);
    PrintDiff::~PrintDiff(this_00);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe990);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffe990);
  std::array<ktx::InputStream,_2UL>::~array(in_stack_ffffffffffffe990);
  return;
}

Assistant:

void CommandCompare::executeCompare() {
    InputStreams inputStreams{
        InputStream(options.inputFilepaths[0], *this),
        InputStream(options.inputFilepaths[1], *this),
    };

    std::vector<std::string> validationMessages;
    std::vector<int> validationResults;

    switch (options.format) {
    case OutputFormat::text: {
        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            std::ostringstream messagesOS;
            validationResults.emplace_back(validateIOStream(inputStreams[i], fmtInFile(options.inputFilepaths[i]),
                false, false, [&](const ValidationReport& issue) {
                fmt::print(messagesOS, "{}-{:04}: {}\n", toString(issue.type), issue.id, issue.message);
                fmt::print(messagesOS, "    {}\n", issue.details);
            }));

            validationMessages.emplace_back(std::move(messagesOS).str());
        }

        bool hasValidationMessages = false;
        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            if (!validationMessages[i].empty()) {
                if (std::exchange(hasValidationMessages, true))
                    fmt::print("\n");

                fmt::print("Validation {} for '{}'\n", validationResults[i] == 0 ? "successful" : "failed",
                            options.inputFilepaths[i]);
                fmt::print("\n");
                fmt::print("{}", validationMessages[i]);
            }
        }

        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            if (validationResults[i] != 0) {
                if (validationResults[i] != +rc::INVALID_FILE || !options.allowInvalidInput)
                    throw FatalError(ReturnCode{validationResults[i]});

                // Image comparison is only supported for valid input files
                options.contentMode = ContentMode::ignore;
            }
        }

        if (hasValidationMessages)
            fmt::print("\n");

        PrintIndent out{std::cout};
        PrintDiff diff(out, options.format);
        compareHeader(diff, inputStreams);
        compareLevelIndex(diff, inputStreams);
        compareDFD(diff, inputStreams);
        compareKVD(diff, inputStreams);
        compareSGD(diff, inputStreams);
        compareImages(diff, inputStreams);

        if (diff.isDifferent())
            throw FatalError(rc::DIFFERENCE_FOUND);

        break;
    }
    case OutputFormat::json: [[fallthrough]];
    case OutputFormat::json_mini: {
        int fatalValidationError = 0;

        const auto baseIndent = options.format == OutputFormat::json ? +0 : 0;
        const auto indentWidth = options.format == OutputFormat::json ? 4 : 0;
        const auto space = options.format == OutputFormat::json ? " " : "";
        const auto nl = options.format == OutputFormat::json ? "\n" : "";

        PrintIndent out{std::cout, baseIndent, indentWidth};
        out(0, "{{{}", nl);
        out(1, "\"$schema\":{}\"https://schema.khronos.org/ktx/compare_v0.json\",{}", space, nl);

        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            std::ostringstream messagesOS;
            PrintIndent pi{messagesOS, baseIndent, indentWidth};

            bool first = true;
            validationResults.emplace_back(validateIOStream(inputStreams[i], fmtInFile(options.inputFilepaths[i]),
                false, false, [&](const ValidationReport& issue) {
                if (!std::exchange(first, false)) {
                    pi(3, "}},{}", nl);
                }
                pi(3, "{{{}", nl);
                pi(4, "\"id\":{}{},{}", space, issue.id, nl);
                pi(4, "\"type\":{}\"{}\",{}", space, toString(issue.type), nl);
                pi(4, "\"message\":{}\"{}\",{}", space, escape_json_copy(issue.message), nl);
                pi(4, "\"details\":{}\"{}\"{}", space, escape_json_copy(issue.details), nl);
            }));

            validationMessages.emplace_back(std::move(messagesOS).str());
        }

        out(1, "\"valid\":{}[{}", space, nl);
        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            bool last = (i == inputStreams.size() - 1);
            out(2, "{}{}{}", validationResults[i] == 0, last ? "" : ",", nl);
        }
        out(1, "],{}", nl);

        out(1, "\"messages\":{}[{}", space, nl);
        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            bool last = (i == inputStreams.size() - 1);
            if (!validationMessages[i].empty()) {
                out(2, "[{}", nl);
                fmt::print("{}", validationMessages[i]);
                out(3, "}}{}", nl);
                out(2, "]{}{}", last ? "" : ",", nl);
            } else {
                out(2, "[]{}{}", last ? "" : ",", nl);
            }
        }
        out(1, "]");

        for (std::size_t i = 0; i < inputStreams.size(); ++i) {
            if (validationResults[i] != 0) {
                if (validationResults[i] != +rc::INVALID_FILE || !options.allowInvalidInput) {
                    fatalValidationError = validationResults[i];
                    break;
                }

                // Image comparison is only supported for valid input files
                options.contentMode = ContentMode::ignore;
            }
        }

        PrintDiff diff(out, options.format);

        try {
            if (fatalValidationError)
                throw FatalError(ReturnCode{fatalValidationError});

            diff.beginJsonSection("info");
            compareHeader(diff, inputStreams);
            compareLevelIndex(diff, inputStreams);
            compareDFD(diff, inputStreams);
            compareKVD(diff, inputStreams);
            compareSGD(diff, inputStreams);
            diff.endJsonSection();

            diff.beginJsonSection("image");
            compareImages(diff, inputStreams);
            diff.endJsonSection();

            if (diff.isDifferent())
                throw FatalError(rc::DIFFERENCE_FOUND);
        } catch (...) {
            diff.endJsonSection();
            fmt::print("{}}}{}", nl, nl);
            throw;
        }
        fmt::print("{}}}{}", nl, nl);
        break;
    }
    }
}